

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_packed_varyings.cpp
# Opt level: O3

uint __thiscall
anon_unknown.dwarf_184d19::lower_packed_varyings_visitor::lower_rvalue
          (lower_packed_varyings_visitor *this,ir_rvalue *rvalue,uint fine_location,
          ir_variable *unpacked_var,char *name,bool gs_input_toplevel,uint vertex_index)

{
  byte bVar1;
  char cVar2;
  exec_node *peVar3;
  deref lhs;
  deref lhs_00;
  deref lhs_01;
  lower_packed_varyings_visitor *plVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  ir_dereference_record *this_00;
  char *pcVar10;
  ir_swizzle *this_01;
  ir_swizzle *this_02;
  undefined4 extraout_var_00;
  char *name_00;
  glsl_type *pgVar11;
  ir_variable *piVar12;
  ir_dereference_array *this_03;
  ir_constant *this_04;
  ir_dereference_array *this_05;
  undefined4 extraout_var_01;
  operand oVar13;
  undefined4 extraout_var_02;
  operand a;
  undefined4 extraout_var_04;
  operand a_00;
  operand a_01;
  operand a_02;
  operand a_03;
  operand a_04;
  operand a_05;
  operand oVar14;
  ir_assignment *piVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint8_t *puVar20;
  exec_node *peVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  exec_list *peVar25;
  int iVar26;
  ir_expression_operation iVar27;
  glsl_type *t;
  ulong uVar28;
  uint uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  char right_swizzle_name [4];
  char left_swizzle_name [4];
  uint right_swizzle_values [4];
  uint swizzle_values [4];
  deref local_70;
  deref local_68;
  lower_packed_varyings_visitor *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  uint local_34;
  undefined4 extraout_var_03;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  
  pgVar11 = rvalue->type;
  uVar8 = *(uint *)&pgVar11->field_0x4;
  uVar6 = uVar8 & 0xff;
  bVar16 = 0;
  if ((byte)(uVar6 - 4) < 10) {
    bVar16 = (byte)*(undefined4 *)(&DAT_0022ad98 + (ulong)(uVar6 - 4 & 0xff) * 4);
  }
  if (gs_input_toplevel && uVar6 != 0x11) {
    __assert_fail("!gs_input_toplevel || rvalue->type->is_array()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,0x20d,
                  "unsigned int (anonymous namespace)::lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *, unsigned int, ir_variable *, const char *, bool, unsigned int)"
                 );
  }
  if ((byte)uVar8 == 0x11) {
    uVar22 = pgVar11->length;
LAB_001edd8c:
    uVar8 = lower_arraylike(this,rvalue,uVar22,fine_location,unpacked_var,name,gs_input_toplevel,
                            vertex_index);
    return uVar8;
  }
  if (uVar6 == 0xf) {
    if (pgVar11->length == 0) {
      return fine_location;
    }
    lVar24 = 0;
    uVar28 = 0;
    do {
      if (lVar24 != 0) {
        iVar7 = (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,this->mem_ctx,0);
        rvalue = (ir_rvalue *)CONCAT44(extraout_var,iVar7);
      }
      pcVar10 = *(char **)(&((rvalue->type->fields).array)->vector_elements + lVar24);
      this_00 = (ir_dereference_record *)exec_node::operator_new(0x38,this->mem_ctx);
      ir_dereference_record::ir_dereference_record(this_00,rvalue,pcVar10);
      pcVar10 = ralloc_asprintf(this->mem_ctx,"%s.%s",name,pcVar10);
      fine_location =
           lower_rvalue(this,(ir_rvalue *)this_00,fine_location,unpacked_var,pcVar10,false,
                        vertex_index);
      uVar28 = uVar28 + 1;
      lVar24 = lVar24 + 0x30;
    } while (uVar28 < rvalue->type->length);
    return fine_location;
  }
  uVar22 = (uint)pgVar11->matrix_columns;
  if (uVar6 - 2 < 3 && 1 < uVar22) {
    gs_input_toplevel = false;
    goto LAB_001edd8c;
  }
  bVar1 = pgVar11->vector_elements;
  uVar22 = (uint)bVar1 << (bVar16 & 0x1f);
  uVar6 = fine_location & 3;
  uVar29 = (uint)bVar1;
  if (4 < uVar22 + uVar6) {
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68.val._0_4_ = 0;
    local_70.val._0_4_ = 0;
    uVar22 = 4 - uVar6;
    if (((byte)uVar8 < 0xe) && ((0x3610U >> (uVar8 & 0x1f) & 1) != 0)) {
      uVar22 = uVar22 >> 1;
      uVar29 = bVar1 - uVar22;
      if (uVar6 == 3) {
        uVar22 = 0;
        bVar5 = true;
        goto LAB_001ee0b9;
      }
    }
    else {
      uVar29 = uVar29 - uVar22;
    }
    memcpy(&local_68,"xyzw",(ulong)uVar22);
    lVar24 = (ulong)uVar22 - 1;
    auVar31._8_4_ = (int)lVar24;
    auVar31._0_8_ = lVar24;
    auVar31._12_4_ = (int)((ulong)lVar24 >> 0x20);
    uVar28 = 0;
    auVar31 = auVar31 ^ _DAT_002001c0;
    auVar33 = _DAT_002001b0;
    do {
      auVar34 = auVar33 ^ _DAT_002001c0;
      if ((bool)(~(auVar34._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar34._0_4_ ||
                  auVar31._4_4_ < auVar34._4_4_) & 1)) {
        *(int *)(local_48 + uVar28 * 4) = (int)uVar28;
      }
      if ((auVar34._12_4_ != auVar31._12_4_ || auVar34._8_4_ <= auVar31._8_4_) &&
          auVar34._12_4_ <= auVar31._12_4_) {
        *(int *)(local_48 + uVar28 * 4 + 4) = (int)uVar28 + 1;
      }
      uVar28 = uVar28 + 2;
      lVar24 = auVar33._8_8_;
      auVar33._0_8_ = auVar33._0_8_ + 2;
      auVar33._8_8_ = lVar24 + 2;
    } while ((uVar22 + 1 & 0xfffffffe) != uVar28);
    bVar5 = false;
LAB_001ee0b9:
    if (uVar22 != bVar1) {
      uVar28 = 0;
      do {
        uVar8 = uVar22 + (int)uVar28;
        *(uint *)(local_58 + uVar28 * 4) = uVar8;
        *(char *)((long)&local_70.val + uVar28) = "xyzw"[uVar8];
        uVar28 = uVar28 + 1;
      } while (uVar29 != uVar28);
    }
    this_01 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
    ir_swizzle::ir_swizzle(this_01,rvalue,(uint *)local_48,uVar22);
    this_02 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
    iVar7 = (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,this->mem_ctx,0);
    ir_swizzle::ir_swizzle
              (this_02,(ir_rvalue *)CONCAT44(extraout_var_00,iVar7),(uint *)local_58,uVar29);
    pcVar10 = ralloc_asprintf(this->mem_ctx,"%s.%s",name,&local_68);
    name_00 = ralloc_asprintf(this->mem_ctx,"%s.%s",name,&local_70);
    if (bVar5) {
      uVar8 = fine_location + 1;
    }
    else {
      uVar8 = lower_rvalue(this,(ir_rvalue *)this_01,fine_location,unpacked_var,pcVar10,false,
                           vertex_index);
    }
    uVar8 = lower_rvalue(this,(ir_rvalue *)this_02,uVar8,unpacked_var,name_00,false,vertex_index);
    return uVar8;
  }
  local_48 = (undefined1  [16])0x0;
  if (bVar1 != 0) {
    uVar9 = uVar22 + (uVar22 == 0);
    lVar24 = (ulong)uVar9 - 1;
    auVar30._8_4_ = (int)lVar24;
    auVar30._0_8_ = lVar24;
    auVar30._12_4_ = (int)((ulong)lVar24 >> 0x20);
    lVar24 = 1;
    auVar30 = auVar30 ^ _DAT_002001c0;
    auVar34 = _DAT_002001b0;
    uVar8 = uVar6;
    do {
      auVar33 = auVar34 ^ _DAT_002001c0;
      if ((bool)(~(auVar33._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar33._0_4_ ||
                  auVar30._4_4_ < auVar33._4_4_) & 1)) {
        *(uint *)(local_48 + lVar24 * 4 + -4) = uVar8;
      }
      if ((auVar33._12_4_ != auVar30._12_4_ || auVar33._8_4_ <= auVar30._8_4_) &&
          auVar33._12_4_ <= auVar30._12_4_) {
        *(uint *)(local_48 + lVar24 * 4) = uVar8 + 1;
      }
      lVar32 = auVar34._8_8_;
      auVar34._0_8_ = auVar34._0_8_ + 2;
      auVar34._8_8_ = lVar32 + 2;
      lVar32 = lVar24 - (ulong)(uVar9 + 1 & 0xe);
      lVar24 = lVar24 + 2;
      uVar8 = uVar8 + 2;
    } while (lVar32 != -1);
  }
  uVar8 = (fine_location >> 2) - 0x20;
  if (this->locations_used <= uVar8) {
    __assert_fail("slot < locations_used",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,700,
                  "ir_dereference *(anonymous namespace)::lower_packed_varyings_visitor::get_packed_varying_deref(unsigned int, ir_variable *, const char *, unsigned int)"
                 );
  }
  piVar12 = this->packed_varyings[uVar8];
  local_60 = this;
  local_34 = uVar29;
  if (piVar12 == (ir_variable *)0x0) {
    pcVar10 = ralloc_asprintf(this->mem_ctx,"packed:%s",name);
    puVar20 = this->components;
    if (puVar20[uVar8] == '\0') {
      __assert_fail("components[slot] != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x2c0,
                    "ir_dereference *(anonymous namespace)::lower_packed_varyings_visitor::get_packed_varying_deref(unsigned int, ir_variable *, const char *, unsigned int)"
                   );
    }
    uVar29 = 1;
    if (((undefined1  [44])unpacked_var->data & (undefined1  [44])0x30000) !=
        (undefined1  [44])0x20000) {
      bVar5 = glsl_type::contains_integer(unpacked_var->type);
      if (bVar5) {
        puVar20 = local_60->components;
      }
      else {
        bVar5 = glsl_type::contains_double(unpacked_var->type);
        puVar20 = local_60->components;
        uVar29 = 2 - bVar5;
      }
    }
    plVar4 = local_60;
    pgVar11 = glsl_type::get_instance(uVar29,(uint)puVar20[uVar8],1,0,false);
    if (plVar4->gs_input_vertices != 0) {
      pgVar11 = glsl_type::get_array_instance(pgVar11,plVar4->gs_input_vertices,0);
    }
    plVar4 = local_60;
    piVar12 = (ir_variable *)exec_node::operator_new(0x90,local_60->mem_ctx);
    ir_variable::ir_variable(piVar12,pgVar11,pcVar10,plVar4->mode);
    uVar29 = plVar4->gs_input_vertices;
    if (uVar29 != 0) {
      (piVar12->data).max_array_access = uVar29 - 1;
    }
    uVar9 = *(uint *)&unpacked_var->data & 2;
    uVar29 = *(uint *)&piVar12->data;
    *(uint *)&piVar12->data = uVar29 & 0xfffffffd | uVar9;
    uVar17 = *(uint *)&unpacked_var->data & 4;
    *(uint *)&piVar12->data = uVar29 & 0xfffffff9 | uVar9 | uVar17;
    uVar18 = *(uint *)&unpacked_var->data & 8;
    *(uint *)&piVar12->data = uVar29 & 0xfffffff1 | uVar9 | uVar17 | uVar18;
    for (; pgVar11->field_0x4 == '\x11'; pgVar11 = (pgVar11->fields).array) {
    }
    if (pgVar11 == &glsl_type::_ivec4_type) {
      uVar19 = 0x20000;
    }
    else {
      uVar19 = *(uint *)&unpacked_var->data & 0x30000;
    }
    *(uint *)&piVar12->data = uVar29 & 0xfffcfff1 | uVar9 | uVar17 | uVar18 | uVar19;
    (piVar12->data).location = fine_location >> 2;
    *(ushort *)&(piVar12->data).field_0x4 =
         (ushort)*(undefined4 *)&(piVar12->data).field_0x4 & 0xff9f |
         *(ushort *)&(unpacked_var->data).field_0x4 & 0x60;
    *(uint *)&piVar12->data =
         uVar29 & 0xfffcfdf1 | uVar9 | uVar17 | uVar18 | uVar19 |
         *(uint *)&unpacked_var->data & 0x200;
    (piVar12->data).stream = 0x80000000;
    peVar21 = &(piVar12->super_ir_instruction).super_exec_node;
    (piVar12->super_ir_instruction).super_exec_node.next =
         &(unpacked_var->super_ir_instruction).super_exec_node;
    peVar3 = (unpacked_var->super_ir_instruction).super_exec_node.prev;
    (piVar12->super_ir_instruction).super_exec_node.prev = peVar3;
    peVar3->next = peVar21;
    (unpacked_var->super_ir_instruction).super_exec_node.prev = peVar21;
    local_60->packed_varyings[uVar8] = piVar12;
  }
  else {
    *(uint *)&piVar12->data = *(uint *)&piVar12->data | *(uint *)&unpacked_var->data & 0x200;
    if ((vertex_index == 0) || (this->gs_input_vertices == 0)) {
      pcVar10 = piVar12->name;
      if (pcVar10 == piVar12->name_storage || pcVar10 == "compiler_temp") {
        pcVar10 = ralloc_asprintf(piVar12,"%s,%s",pcVar10,name);
        piVar12->name = pcVar10;
      }
      else {
        ralloc_asprintf_append(&piVar12->name,",%s",name);
      }
    }
  }
  plVar4 = local_60;
  this_03 = (ir_dereference_array *)exec_node::operator_new(0x30,local_60->mem_ctx);
  ir_dereference_variable::ir_dereference_variable
            ((ir_dereference_variable *)this_03,plVar4->packed_varyings[uVar8]);
  this_05 = this_03;
  if (plVar4->gs_input_vertices != 0) {
    this_04 = (ir_constant *)exec_node::operator_new(0xb0,plVar4->mem_ctx);
    ir_constant::ir_constant(this_04,vertex_index,1);
    this_05 = (ir_dereference_array *)exec_node::operator_new(0x38,plVar4->mem_ctx);
    ir_dereference_array::ir_dereference_array(this_05,(ir_rvalue *)this_03,(ir_rvalue *)this_04);
  }
  uVar8 = (unpacked_var->data).stream;
  if (uVar8 != 0) {
    if (3 < uVar8) {
      __assert_fail("unpacked_var->data.stream < 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x267,
                    "unsigned int (anonymous namespace)::lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *, unsigned int, ir_variable *, const char *, bool, unsigned int)"
                   );
    }
    iVar7 = (*(this_05->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
              _vptr_ir_instruction[8])(this_05);
    if ((char)local_34 != '\0') {
      iVar23 = uVar22 + (uVar22 == 0);
      uVar8 = *(uint *)(CONCAT44(extraout_var_01,iVar7) + 0x58);
      iVar26 = uVar6 * 2;
      do {
        uVar8 = uVar8 | (unpacked_var->data).stream << ((byte)iVar26 & 0x1f);
        *(uint *)(CONCAT44(extraout_var_01,iVar7) + 0x58) = uVar8;
        iVar26 = iVar26 + 2;
        iVar23 = iVar23 + -1;
      } while (iVar23 != 0);
    }
  }
  oVar13.val = (ir_rvalue *)exec_node::operator_new(0x38,plVar4->mem_ctx);
  ir_swizzle::ir_swizzle((ir_swizzle *)oVar13.val,(ir_rvalue *)this_05,(uint *)local_48,uVar22);
  if (plVar4->mode == ir_var_shader_out) {
    cVar2 = (oVar13.val)->type->field_0x4;
    pgVar11 = rvalue->type;
    oVar14.val = rvalue;
    if (cVar2 == pgVar11->field_0x4) goto LAB_001eee07;
    if (cVar2 != '\x01') {
      __assert_fail("lhs->type->base_type == GLSL_TYPE_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x14c,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    switch(pgVar11->field_0x4) {
    case 0:
      oVar14.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar4->mem_ctx);
      pgVar11 = (oVar13.val)->type;
      iVar7 = 0x16;
      goto LAB_001ee7c6;
    default:
      __assert_fail("!\"Unexpected type conversion while lowering varyings\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x18d,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                   );
    case 2:
      oVar14.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar4->mem_ctx);
      pgVar11 = (oVar13.val)->type;
      iVar7 = 0x23;
LAB_001ee7c6:
      ir_expression::ir_expression
                ((ir_expression *)oVar14.val,iVar7,pgVar11,rvalue,(ir_rvalue *)0x0,(ir_rvalue *)0x0,
                 (ir_rvalue *)0x0);
      break;
    case 4:
      if (2 < pgVar11->vector_elements) {
        __assert_fail("rhs->type->vector_elements <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x157,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      if (pgVar11->vector_elements != 2) {
        iVar27 = ir_unop_unpack_double_2x32;
        goto LAB_001eedf4;
      }
      piVar12 = (ir_variable *)exec_node::operator_new(0x90,plVar4->mem_ctx);
      ir_variable::ir_variable(piVar12,(oVar13.val)->type,"pack",ir_var_temporary);
      if ((oVar13.val)->type->vector_elements != '\x04') {
        __assert_fail("lhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x15b,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar25 = plVar4->out_variables;
      peVar21 = &(piVar12->super_ir_instruction).super_exec_node;
      (piVar12->super_ir_instruction).super_exec_node.next = &peVar25->tail_sentinel;
      peVar3 = (peVar25->tail_sentinel).prev;
      (piVar12->super_ir_instruction).super_exec_node.prev = peVar3;
      peVar3->next = peVar21;
      (peVar25->tail_sentinel).prev = peVar21;
      peVar25 = plVar4->out_instructions;
      ir_builder::deref::deref((deref *)local_58,piVar12);
      a_00.val._0_4_ =
           (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,plVar4->mem_ctx,0);
      a_00.val._4_4_ = extraout_var_05;
      oVar14.val = &ir_builder::swizzle_x(a_00)->super_ir_rvalue;
      oVar14.val = &ir_builder::expr(ir_unop_unpack_double_2x32,oVar14)->super_ir_rvalue;
      oVar14.val = &ir_builder::u2i(oVar14)->super_ir_rvalue;
      piVar15 = ir_builder::assign((deref)local_58._0_8_,oVar14,3);
      if (piVar15 != (ir_assignment *)0x0) {
        piVar15 = (ir_assignment *)&(piVar15->super_ir_instruction).super_exec_node;
      }
      (piVar15->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar25->tail_sentinel;
      peVar3 = (peVar25->tail_sentinel).prev;
      (piVar15->super_ir_instruction).super_exec_node.next = peVar3;
      peVar3->next = (exec_node *)piVar15;
      (peVar25->tail_sentinel).prev = (exec_node *)piVar15;
      peVar25 = plVar4->out_instructions;
      ir_builder::deref::deref(&local_68,piVar12);
      oVar14.val = &ir_builder::swizzle_y(rvalue)->super_ir_rvalue;
      iVar27 = ir_unop_unpack_double_2x32;
LAB_001eeb85:
      oVar14.val = &ir_builder::expr(iVar27,oVar14)->super_ir_rvalue;
      oVar14.val = &ir_builder::u2i(oVar14)->super_ir_rvalue;
LAB_001eeb95:
      lhs_00.val._4_4_ = local_68.val._4_4_;
      lhs_00.val._0_4_ = local_68.val._0_4_;
      piVar15 = ir_builder::assign(lhs_00,oVar14,0xc);
      if (piVar15 != (ir_assignment *)0x0) {
        piVar15 = (ir_assignment *)&(piVar15->super_ir_instruction).super_exec_node;
      }
      (piVar15->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar25->tail_sentinel;
      peVar3 = (peVar25->tail_sentinel).prev;
      (piVar15->super_ir_instruction).super_exec_node.next = peVar3;
      peVar3->next = (exec_node *)piVar15;
      (peVar25->tail_sentinel).prev = (exec_node *)piVar15;
      ir_builder::deref::deref(&local_70,piVar12);
      oVar14.val = (ir_rvalue *)CONCAT44(local_70.val._4_4_,local_70.val._0_4_);
      break;
    case 9:
      if (2 < pgVar11->vector_elements) {
        __assert_fail("rhs->type->vector_elements <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x177,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      if (pgVar11->vector_elements == 2) {
        piVar12 = (ir_variable *)exec_node::operator_new(0x90,plVar4->mem_ctx);
        ir_variable::ir_variable(piVar12,(oVar13.val)->type,"pack",ir_var_temporary);
        if ((oVar13.val)->type->vector_elements != '\x04') {
          __assert_fail("lhs->type->vector_elements == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                        ,0x17b,
                        "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                       );
        }
        peVar25 = plVar4->out_variables;
        peVar21 = &(piVar12->super_ir_instruction).super_exec_node;
        (piVar12->super_ir_instruction).super_exec_node.next = &peVar25->tail_sentinel;
        peVar3 = (peVar25->tail_sentinel).prev;
        (piVar12->super_ir_instruction).super_exec_node.prev = peVar3;
        peVar3->next = peVar21;
        (peVar25->tail_sentinel).prev = peVar21;
        peVar25 = plVar4->out_instructions;
        ir_builder::deref::deref((deref *)local_58,piVar12);
        a_03.val._0_4_ =
             (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,plVar4->mem_ctx,0);
        a_03.val._4_4_ = extraout_var_08;
        oVar14.val = &ir_builder::swizzle_x(a_03)->super_ir_rvalue;
        oVar14.val = &ir_builder::expr(ir_last_unop,oVar14)->super_ir_rvalue;
        oVar14.val = &ir_builder::u2i(oVar14)->super_ir_rvalue;
        piVar15 = ir_builder::assign((deref)local_58._0_8_,oVar14,3);
        if (piVar15 != (ir_assignment *)0x0) {
          piVar15 = (ir_assignment *)&(piVar15->super_ir_instruction).super_exec_node;
        }
        (piVar15->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar25->tail_sentinel
        ;
        peVar3 = (peVar25->tail_sentinel).prev;
        (piVar15->super_ir_instruction).super_exec_node.next = peVar3;
        peVar3->next = (exec_node *)piVar15;
        (peVar25->tail_sentinel).prev = (exec_node *)piVar15;
        peVar25 = plVar4->out_instructions;
        ir_builder::deref::deref(&local_68,piVar12);
        oVar14.val = &ir_builder::swizzle_y(rvalue)->super_ir_rvalue;
        iVar27 = ir_last_unop;
        goto LAB_001eeb85;
      }
      iVar27 = ir_last_unop;
      goto LAB_001eedf4;
    case 10:
      if (2 < pgVar11->vector_elements) {
        __assert_fail("rhs->type->vector_elements <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x167,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      if (pgVar11->vector_elements == 2) {
        piVar12 = (ir_variable *)exec_node::operator_new(0x90,plVar4->mem_ctx);
        ir_variable::ir_variable(piVar12,(oVar13.val)->type,"pack",ir_var_temporary);
        if ((oVar13.val)->type->vector_elements != '\x04') {
          __assert_fail("lhs->type->vector_elements == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                        ,0x16b,
                        "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                       );
        }
        peVar25 = plVar4->out_variables;
        peVar21 = &(piVar12->super_ir_instruction).super_exec_node;
        (piVar12->super_ir_instruction).super_exec_node.next = &peVar25->tail_sentinel;
        peVar3 = (peVar25->tail_sentinel).prev;
        (piVar12->super_ir_instruction).super_exec_node.prev = peVar3;
        peVar3->next = peVar21;
        (peVar25->tail_sentinel).prev = peVar21;
        peVar25 = plVar4->out_instructions;
        ir_builder::deref::deref((deref *)local_58,piVar12);
        oVar14.val._0_4_ =
             (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,plVar4->mem_ctx,0);
        oVar14.val._4_4_ = extraout_var_02;
        oVar14.val = &ir_builder::swizzle_x(oVar14)->super_ir_rvalue;
        oVar14.val = &ir_builder::expr(ir_unop_unpack_int_2x32,oVar14)->super_ir_rvalue;
        piVar15 = ir_builder::assign((deref)local_58._0_8_,oVar14,3);
        if (piVar15 != (ir_assignment *)0x0) {
          piVar15 = (ir_assignment *)&(piVar15->super_ir_instruction).super_exec_node;
        }
        (piVar15->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar25->tail_sentinel
        ;
        peVar3 = (peVar25->tail_sentinel).prev;
        (piVar15->super_ir_instruction).super_exec_node.next = peVar3;
        peVar3->next = (exec_node *)piVar15;
        (peVar25->tail_sentinel).prev = (exec_node *)piVar15;
        peVar25 = plVar4->out_instructions;
        ir_builder::deref::deref(&local_68,piVar12);
        oVar14.val = &ir_builder::swizzle_y(rvalue)->super_ir_rvalue;
        oVar14.val = &ir_builder::expr(ir_unop_unpack_int_2x32,oVar14)->super_ir_rvalue;
        goto LAB_001eeb95;
      }
      oVar14.val = &ir_builder::expr(ir_unop_unpack_int_2x32,rvalue)->super_ir_rvalue;
      break;
    case 0xc:
      iVar27 = ir_unop_unpack_sampler_2x32;
      goto LAB_001eedf4;
    case 0xd:
      iVar27 = ir_unop_unpack_image_2x32;
LAB_001eedf4:
      oVar14.val = &ir_builder::expr(iVar27,rvalue)->super_ir_rvalue;
      oVar14.val = &ir_builder::u2i(oVar14)->super_ir_rvalue;
    }
LAB_001eee07:
    peVar25 = plVar4->out_instructions;
    piVar15 = (ir_assignment *)exec_node::operator_new(0x40,plVar4->mem_ctx);
    rvalue = oVar13.val;
    goto LAB_001eee5b;
  }
  pgVar11 = rvalue->type;
  cVar2 = (oVar13.val)->type->field_0x4;
  oVar14.val = oVar13.val;
  if (pgVar11->field_0x4 == cVar2) goto LAB_001eee3e;
  if (cVar2 != '\x01') {
    __assert_fail("rhs->type->base_type == GLSL_TYPE_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,0x1a4,
                  "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                 );
  }
  switch(pgVar11->field_0x4) {
  case 0:
    oVar14.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar4->mem_ctx);
    pgVar11 = rvalue->type;
    iVar7 = 0x15;
    break;
  default:
    __assert_fail("!\"Unexpected type conversion while lowering varyings\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,0x1e4,
                  "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                 );
  case 2:
    oVar14.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar4->mem_ctx);
    pgVar11 = rvalue->type;
    iVar7 = 0x22;
    break;
  case 4:
    if (2 < pgVar11->vector_elements) {
      __assert_fail("lhs->type->vector_elements <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x1af,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    if (pgVar11->vector_elements == 2) {
      piVar12 = (ir_variable *)exec_node::operator_new(0x90,plVar4->mem_ctx);
      ir_variable::ir_variable(piVar12,rvalue->type,"unpack",ir_var_temporary);
      if ((oVar13.val)->type->vector_elements != '\x04') {
        __assert_fail("rhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1b2,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar25 = plVar4->out_variables;
      peVar21 = &(piVar12->super_ir_instruction).super_exec_node;
      (piVar12->super_ir_instruction).super_exec_node.next = &peVar25->tail_sentinel;
      peVar3 = (peVar25->tail_sentinel).prev;
      (piVar12->super_ir_instruction).super_exec_node.prev = peVar3;
      peVar3->next = peVar21;
      (peVar25->tail_sentinel).prev = peVar21;
      peVar25 = plVar4->out_instructions;
      ir_builder::deref::deref((deref *)local_58,piVar12);
      a_01.val._0_4_ =
           (*((oVar13.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar13.val,plVar4->mem_ctx,0);
      a_01.val._4_4_ = extraout_var_06;
      oVar14.val = &ir_builder::swizzle_xy(a_01)->super_ir_rvalue;
      oVar14.val = &ir_builder::i2u(oVar14)->super_ir_rvalue;
      oVar14.val = &ir_builder::expr(ir_unop_pack_double_2x32,oVar14)->super_ir_rvalue;
      piVar15 = ir_builder::assign((deref)local_58._0_8_,oVar14,1);
      if (piVar15 != (ir_assignment *)0x0) {
        piVar15 = (ir_assignment *)&(piVar15->super_ir_instruction).super_exec_node;
      }
      (piVar15->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar25->tail_sentinel;
      peVar3 = (peVar25->tail_sentinel).prev;
      (piVar15->super_ir_instruction).super_exec_node.next = peVar3;
      peVar3->next = (exec_node *)piVar15;
      (peVar25->tail_sentinel).prev = (exec_node *)piVar15;
      peVar25 = plVar4->out_instructions;
      ir_builder::deref::deref(&local_68,piVar12);
      a_02.val._0_4_ =
           (*((oVar13.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar13.val,plVar4->mem_ctx,0);
      a_02.val._4_4_ = extraout_var_07;
      oVar13.val = &ir_builder::swizzle(a_02,0x69a,2)->super_ir_rvalue;
      oVar13.val = &ir_builder::i2u(oVar13)->super_ir_rvalue;
      iVar27 = ir_unop_pack_double_2x32;
LAB_001eed07:
      oVar13.val = &ir_builder::expr(iVar27,oVar13)->super_ir_rvalue;
      lhs_01.val._4_4_ = local_68.val._4_4_;
      lhs_01.val._0_4_ = local_68.val._0_4_;
      piVar15 = ir_builder::assign(lhs_01,oVar13,2);
      if (piVar15 != (ir_assignment *)0x0) {
        piVar15 = (ir_assignment *)&(piVar15->super_ir_instruction).super_exec_node;
      }
      (piVar15->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar25->tail_sentinel;
      peVar3 = (peVar25->tail_sentinel).prev;
      (piVar15->super_ir_instruction).super_exec_node.next = peVar3;
      peVar3->next = (exec_node *)piVar15;
      (peVar25->tail_sentinel).prev = (exec_node *)piVar15;
      ir_builder::deref::deref(&local_70,piVar12);
      oVar14.val = (ir_rvalue *)CONCAT44(local_70.val._4_4_,local_70.val._0_4_);
      goto LAB_001eee3e;
    }
    oVar13.val = &ir_builder::i2u(oVar13)->super_ir_rvalue;
    iVar27 = ir_unop_pack_double_2x32;
    goto LAB_001eee36;
  case 9:
    if (2 < pgVar11->vector_elements) {
      __assert_fail("lhs->type->vector_elements <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x1cd,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    if (pgVar11->vector_elements == 2) {
      piVar12 = (ir_variable *)exec_node::operator_new(0x90,plVar4->mem_ctx);
      ir_variable::ir_variable(piVar12,rvalue->type,"unpack",ir_var_temporary);
      if ((oVar13.val)->type->vector_elements != '\x04') {
        __assert_fail("rhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1d0,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar25 = plVar4->out_variables;
      peVar21 = &(piVar12->super_ir_instruction).super_exec_node;
      (piVar12->super_ir_instruction).super_exec_node.next = &peVar25->tail_sentinel;
      peVar3 = (peVar25->tail_sentinel).prev;
      (piVar12->super_ir_instruction).super_exec_node.prev = peVar3;
      peVar3->next = peVar21;
      (peVar25->tail_sentinel).prev = peVar21;
      peVar25 = plVar4->out_instructions;
      ir_builder::deref::deref((deref *)local_58,piVar12);
      a_04.val._0_4_ =
           (*((oVar13.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar13.val,plVar4->mem_ctx,0);
      a_04.val._4_4_ = extraout_var_09;
      oVar14.val = &ir_builder::swizzle_xy(a_04)->super_ir_rvalue;
      oVar14.val = &ir_builder::i2u(oVar14)->super_ir_rvalue;
      oVar14.val = &ir_builder::expr(ir_unop_pack_uint_2x32,oVar14)->super_ir_rvalue;
      piVar15 = ir_builder::assign((deref)local_58._0_8_,oVar14,1);
      if (piVar15 != (ir_assignment *)0x0) {
        piVar15 = (ir_assignment *)&(piVar15->super_ir_instruction).super_exec_node;
      }
      (piVar15->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar25->tail_sentinel;
      peVar3 = (peVar25->tail_sentinel).prev;
      (piVar15->super_ir_instruction).super_exec_node.next = peVar3;
      peVar3->next = (exec_node *)piVar15;
      (peVar25->tail_sentinel).prev = (exec_node *)piVar15;
      peVar25 = plVar4->out_instructions;
      ir_builder::deref::deref(&local_68,piVar12);
      a_05.val._0_4_ =
           (*((oVar13.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar13.val,plVar4->mem_ctx,0);
      a_05.val._4_4_ = extraout_var_10;
      oVar13.val = &ir_builder::swizzle(a_05,0x69a,2)->super_ir_rvalue;
      oVar13.val = &ir_builder::i2u(oVar13)->super_ir_rvalue;
      iVar27 = ir_unop_pack_uint_2x32;
      goto LAB_001eed07;
    }
    oVar13.val = &ir_builder::i2u(oVar13)->super_ir_rvalue;
    iVar27 = ir_unop_pack_uint_2x32;
    goto LAB_001eee36;
  case 10:
    if (2 < pgVar11->vector_elements) {
      __assert_fail("lhs->type->vector_elements <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x1be,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    if (pgVar11->vector_elements == 2) {
      piVar12 = (ir_variable *)exec_node::operator_new(0x90,plVar4->mem_ctx);
      ir_variable::ir_variable(piVar12,rvalue->type,"unpack",ir_var_temporary);
      if ((oVar13.val)->type->vector_elements != '\x04') {
        __assert_fail("rhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1c1,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar25 = plVar4->out_variables;
      peVar21 = &(piVar12->super_ir_instruction).super_exec_node;
      (piVar12->super_ir_instruction).super_exec_node.next = &peVar25->tail_sentinel;
      peVar3 = (peVar25->tail_sentinel).prev;
      (piVar12->super_ir_instruction).super_exec_node.prev = peVar3;
      peVar3->next = peVar21;
      (peVar25->tail_sentinel).prev = peVar21;
      peVar25 = plVar4->out_instructions;
      ir_builder::deref::deref((deref *)local_58,piVar12);
      a.val._0_4_ = (*((oVar13.val)->super_ir_instruction)._vptr_ir_instruction[4])
                              (oVar13.val,plVar4->mem_ctx,0);
      a.val._4_4_ = extraout_var_03;
      oVar14.val = &ir_builder::swizzle_xy(a)->super_ir_rvalue;
      oVar14.val = &ir_builder::expr(ir_unop_pack_int_2x32,oVar14)->super_ir_rvalue;
      piVar15 = ir_builder::assign((deref)local_58._0_8_,oVar14,1);
      if (piVar15 != (ir_assignment *)0x0) {
        piVar15 = (ir_assignment *)&(piVar15->super_ir_instruction).super_exec_node;
      }
      (piVar15->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar25->tail_sentinel;
      peVar3 = (peVar25->tail_sentinel).prev;
      (piVar15->super_ir_instruction).super_exec_node.next = peVar3;
      peVar3->next = (exec_node *)piVar15;
      (peVar25->tail_sentinel).prev = (exec_node *)piVar15;
      peVar25 = plVar4->out_instructions;
      ir_builder::deref::deref(&local_68,piVar12);
      oVar13.val._0_4_ =
           (*((oVar13.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar13.val,plVar4->mem_ctx,0);
      oVar13.val._4_4_ = extraout_var_04;
      oVar13.val = &ir_builder::swizzle(oVar13,0x69a,2)->super_ir_rvalue;
      oVar13.val = &ir_builder::expr(ir_unop_pack_int_2x32,oVar13)->super_ir_rvalue;
      lhs.val._4_4_ = local_68.val._4_4_;
      lhs.val._0_4_ = local_68.val._0_4_;
      piVar15 = ir_builder::assign(lhs,oVar13,2);
      if (piVar15 != (ir_assignment *)0x0) {
        piVar15 = (ir_assignment *)&(piVar15->super_ir_instruction).super_exec_node;
      }
      (piVar15->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar25->tail_sentinel;
      peVar3 = (peVar25->tail_sentinel).prev;
      (piVar15->super_ir_instruction).super_exec_node.next = peVar3;
      peVar3->next = (exec_node *)piVar15;
      (peVar25->tail_sentinel).prev = (exec_node *)piVar15;
      ir_builder::deref::deref(&local_70,piVar12);
      oVar14.val = (ir_rvalue *)CONCAT44(local_70.val._4_4_,local_70.val._0_4_);
      goto LAB_001eee3e;
    }
    iVar27 = ir_unop_pack_int_2x32;
LAB_001eee36:
    oVar14.val = &ir_builder::expr(iVar27,oVar13)->super_ir_rvalue;
    goto LAB_001eee3e;
  case 0xc:
    oVar14.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar4->mem_ctx);
    pgVar11 = rvalue->type;
    oVar13.val = &ir_builder::i2u(oVar13)->super_ir_rvalue;
    iVar7 = 0x5e;
    break;
  case 0xd:
    oVar14.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar4->mem_ctx);
    pgVar11 = rvalue->type;
    oVar13.val = &ir_builder::i2u(oVar13)->super_ir_rvalue;
    iVar7 = 0x5f;
  }
  ir_expression::ir_expression
            ((ir_expression *)oVar14.val,iVar7,pgVar11,oVar13.val,(ir_rvalue *)0x0,(ir_rvalue *)0x0,
             (ir_rvalue *)0x0);
LAB_001eee3e:
  peVar25 = plVar4->out_instructions;
  piVar15 = (ir_assignment *)exec_node::operator_new(0x40,plVar4->mem_ctx);
LAB_001eee5b:
  ir_assignment::ir_assignment(piVar15,rvalue,oVar14.val,(ir_rvalue *)0x0);
  peVar3 = &(piVar15->super_ir_instruction).super_exec_node;
  (piVar15->super_ir_instruction).super_exec_node.next = &peVar25->tail_sentinel;
  peVar21 = (peVar25->tail_sentinel).prev;
  (piVar15->super_ir_instruction).super_exec_node.prev = peVar21;
  peVar21->next = peVar3;
  (peVar25->tail_sentinel).prev = peVar3;
  return uVar22 + fine_location;
}

Assistant:

unsigned
lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *rvalue,
                                            unsigned fine_location,
                                            ir_variable *unpacked_var,
                                            const char *name,
                                            bool gs_input_toplevel,
                                            unsigned vertex_index)
{
   unsigned dmul = rvalue->type->is_64bit() ? 2 : 1;
   /* When gs_input_toplevel is set, we should be looking at a geometry shader
    * input array.
    */
   assert(!gs_input_toplevel || rvalue->type->is_array());

   if (rvalue->type->is_struct()) {
      for (unsigned i = 0; i < rvalue->type->length; i++) {
         if (i != 0)
            rvalue = rvalue->clone(this->mem_ctx, NULL);
         const char *field_name = rvalue->type->fields.structure[i].name;
         ir_dereference_record *dereference_record = new(this->mem_ctx)
            ir_dereference_record(rvalue, field_name);
         char *deref_name
            = ralloc_asprintf(this->mem_ctx, "%s.%s", name, field_name);
         fine_location = this->lower_rvalue(dereference_record, fine_location,
                                            unpacked_var, deref_name, false,
                                            vertex_index);
      }
      return fine_location;
   } else if (rvalue->type->is_array()) {
      /* Arrays are packed/unpacked by considering each array element in
       * sequence.
       */
      return this->lower_arraylike(rvalue, rvalue->type->array_size(),
                                   fine_location, unpacked_var, name,
                                   gs_input_toplevel, vertex_index);
   } else if (rvalue->type->is_matrix()) {
      /* Matrices are packed/unpacked by considering each column vector in
       * sequence.
       */
      return this->lower_arraylike(rvalue, rvalue->type->matrix_columns,
                                   fine_location, unpacked_var, name,
                                   false, vertex_index);
   } else if (rvalue->type->vector_elements * dmul +
              fine_location % 4 > 4) {
      /* This vector is going to be "double parked" across two varying slots,
       * so handle it as two separate assignments. For doubles, a dvec3/dvec4
       * can end up being spread over 3 slots. However the second splitting
       * will happen later, here we just always want to split into 2.
       */
      unsigned left_components, right_components;
      unsigned left_swizzle_values[4] = { 0, 0, 0, 0 };
      unsigned right_swizzle_values[4] = { 0, 0, 0, 0 };
      char left_swizzle_name[4] = { 0, 0, 0, 0 };
      char right_swizzle_name[4] = { 0, 0, 0, 0 };

      left_components = 4 - fine_location % 4;
      if (rvalue->type->is_64bit()) {
         /* We might actually end up with 0 left components! */
         left_components /= 2;
      }
      right_components = rvalue->type->vector_elements - left_components;

      for (unsigned i = 0; i < left_components; i++) {
         left_swizzle_values[i] = i;
         left_swizzle_name[i] = "xyzw"[i];
      }
      for (unsigned i = 0; i < right_components; i++) {
         right_swizzle_values[i] = i + left_components;
         right_swizzle_name[i] = "xyzw"[i + left_components];
      }
      ir_swizzle *left_swizzle = new(this->mem_ctx)
         ir_swizzle(rvalue, left_swizzle_values, left_components);
      ir_swizzle *right_swizzle = new(this->mem_ctx)
         ir_swizzle(rvalue->clone(this->mem_ctx, NULL), right_swizzle_values,
                    right_components);
      char *left_name
         = ralloc_asprintf(this->mem_ctx, "%s.%s", name, left_swizzle_name);
      char *right_name
         = ralloc_asprintf(this->mem_ctx, "%s.%s", name, right_swizzle_name);
      if (left_components)
         fine_location = this->lower_rvalue(left_swizzle, fine_location,
                                            unpacked_var, left_name, false,
                                            vertex_index);
      else
         /* Top up the fine location to the next slot */
         fine_location++;
      return this->lower_rvalue(right_swizzle, fine_location, unpacked_var,
                                right_name, false, vertex_index);
   } else {
      /* No special handling is necessary; pack the rvalue into the
       * varying.
       */
      unsigned swizzle_values[4] = { 0, 0, 0, 0 };
      unsigned components = rvalue->type->vector_elements * dmul;
      unsigned location = fine_location / 4;
      unsigned location_frac = fine_location % 4;
      for (unsigned i = 0; i < components; ++i)
         swizzle_values[i] = i + location_frac;
      ir_dereference *packed_deref =
         this->get_packed_varying_deref(location, unpacked_var, name,
                                        vertex_index);
      if (unpacked_var->data.stream != 0) {
         assert(unpacked_var->data.stream < 4);
         ir_variable *packed_var = packed_deref->variable_referenced();
         for (unsigned i = 0; i < components; ++i) {
            packed_var->data.stream |=
               unpacked_var->data.stream << (2 * (location_frac + i));
         }
      }
      ir_swizzle *swizzle = new(this->mem_ctx)
         ir_swizzle(packed_deref, swizzle_values, components);
      if (this->mode == ir_var_shader_out) {
         this->bitwise_assign_pack(swizzle, rvalue);
      } else {
         this->bitwise_assign_unpack(rvalue, swizzle);
      }
      return fine_location + components;
   }
}